

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cpp.cpp
# Opt level: O3

void __thiscall spirv_cross::CompilerCPP::emit_uniform(CompilerCPP *this,SPIRVariable *var)

{
  ID *__k;
  unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
  *this_00;
  uint uVar1;
  uint32_t uVar2;
  SPIRType *pSVar3;
  mapped_type *pmVar4;
  uint32_t location;
  uint32_t binding;
  uint32_t descriptor_set;
  string instance_name;
  string type_name;
  char (*in_stack_ffffffffffffff50) [3];
  char (*in_stack_ffffffffffffff60) [3];
  uint32_t local_94;
  uint32_t local_90;
  uint32_t local_8c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  __k = &(var->super_IVariant).self;
  CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,(var->super_IVariant).self.id);
  pSVar3 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr +
                      *(uint *)&(var->super_IVariant).field_0xc);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
            (&local_68,this,(ulong)(var->super_IVariant).self.id,1);
  this_00 = &(this->super_CompilerGLSL).super_Compiler.ir.meta;
  pmVar4 = ::std::__detail::
           _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_00,__k);
  local_8c = (pmVar4->decoration).set;
  pmVar4 = ::std::__detail::
           _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_00,__k);
  local_90 = (pmVar4->decoration).binding;
  pmVar4 = ::std::__detail::
           _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_00,__k);
  local_94 = (pmVar4->decoration).location;
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_48,this,pSVar3,0);
  if ((this->super_CompilerGLSL).super_Compiler.variable_remap_callback.super__Function_base.
      _M_manager != (_Manager_type)0x0) {
    (*(this->super_CompilerGLSL).super_Compiler.variable_remap_callback._M_invoker)
              ((_Any_data *)&(this->super_CompilerGLSL).super_Compiler.variable_remap_callback,
               pSVar3,&local_68,&local_48);
  }
  uVar1 = *(uint *)&(pSVar3->super_IVariant).field_0xc;
  if ((uVar1 < 0x12) && ((0x30800U >> (uVar1 & 0x1f) & 1) != 0)) {
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x26])(&local_88,this,pSVar3);
    CompilerGLSL::
    statement<char_const(&)[20],std::__cxx11::string&,std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[4]>
              (&this->super_CompilerGLSL,(char (*) [20])"internal::Resource<",&local_48,&local_88,
               (char (*) [3])0x361507,&local_68,(char (*) [4])"__;");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    uVar2 = (this->super_CompilerGLSL).indent;
    (this->super_CompilerGLSL).indent = 0;
    CompilerGLSL::
    statement<char_const(&)[9],std::__cxx11::string&,char_const(&)[9],std::__cxx11::string&,char_const(&)[9]>
              (&this->super_CompilerGLSL,(char (*) [9])"#define ",&local_68,(char (*) [9])" __res->"
               ,&local_68,(char (*) [9])"__.get()");
    (this->super_CompilerGLSL).indent = uVar2;
    join<char_const(&)[21],std::__cxx11::string&,char_const(&)[3],char_const(&)[3],unsigned_int&,char_const(&)[3],unsigned_int&,char_const(&)[3]>
              (&local_88,(spirv_cross *)"s.register_resource(",(char (*) [21])&local_68,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x36d816,
               (char (*) [3])0x376a17,(char (*) [3])&local_8c,(uint *)0x376a17,
               (char (*) [3])&local_90,(uint *)0x361553,in_stack_ffffffffffffff60);
  }
  else {
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x26])(&local_88,this,pSVar3);
    CompilerGLSL::
    statement<char_const(&)[27],std::__cxx11::string&,std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[4]>
              (&this->super_CompilerGLSL,(char (*) [27])"internal::UniformConstant<",&local_48,
               &local_88,(char (*) [3])0x361507,&local_68,(char (*) [4])"__;");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    uVar2 = (this->super_CompilerGLSL).indent;
    (this->super_CompilerGLSL).indent = 0;
    CompilerGLSL::
    statement<char_const(&)[9],std::__cxx11::string&,char_const(&)[9],std::__cxx11::string&,char_const(&)[9]>
              (&this->super_CompilerGLSL,(char (*) [9])"#define ",&local_68,(char (*) [9])" __res->"
               ,&local_68,(char (*) [9])"__.get()");
    (this->super_CompilerGLSL).indent = uVar2;
    join<char_const(&)[29],std::__cxx11::string&,char_const(&)[3],char_const(&)[3],unsigned_int&,char_const(&)[3]>
              (&local_88,(spirv_cross *)"s.register_uniform_constant(",(char (*) [29])&local_68,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x36d816,
               (char (*) [3])0x376a17,(char (*) [3])&local_94,(uint *)0x361553,
               in_stack_ffffffffffffff50);
  }
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::push_back(&this->resource_registrations,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x35713a);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CompilerCPP::emit_uniform(const SPIRVariable &var)
{
	add_resource_name(var.self);

	auto &type = get<SPIRType>(var.basetype);
	auto instance_name = to_name(var.self);

	uint32_t descriptor_set = ir.meta[var.self].decoration.set;
	uint32_t binding = ir.meta[var.self].decoration.binding;
	uint32_t location = ir.meta[var.self].decoration.location;

	string type_name = type_to_glsl(type);
	remap_variable_type_name(type, instance_name, type_name);

	if (type.basetype == SPIRType::Image || type.basetype == SPIRType::SampledImage ||
	    type.basetype == SPIRType::AtomicCounter)
	{
		statement("internal::Resource<", type_name, type_to_array_glsl(type), "> ", instance_name, "__;");
		statement_no_indent("#define ", instance_name, " __res->", instance_name, "__.get()");
		resource_registrations.push_back(
		    join("s.register_resource(", instance_name, "__", ", ", descriptor_set, ", ", binding, ");"));
	}
	else
	{
		statement("internal::UniformConstant<", type_name, type_to_array_glsl(type), "> ", instance_name, "__;");
		statement_no_indent("#define ", instance_name, " __res->", instance_name, "__.get()");
		resource_registrations.push_back(
		    join("s.register_uniform_constant(", instance_name, "__", ", ", location, ");"));
	}

	statement("");
}